

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5StructureRelease(Fts5Structure *pStruct)

{
  int iVar1;
  Fts5StructureSegment **ppFVar2;
  long lVar3;
  
  if ((pStruct != (Fts5Structure *)0x0) &&
     (iVar1 = pStruct->nRef, pStruct->nRef = iVar1 + -1, iVar1 < 2)) {
    ppFVar2 = &pStruct->aLevel[0].aSeg;
    for (lVar3 = 0; lVar3 < pStruct->nLevel; lVar3 = lVar3 + 1) {
      sqlite3_free(*ppFVar2);
      ppFVar2 = ppFVar2 + 2;
    }
    sqlite3_free(pStruct);
    return;
  }
  return;
}

Assistant:

static void fts5StructureRelease(Fts5Structure *pStruct){
  if( pStruct && 0>=(--pStruct->nRef) ){
    int i;
    assert( pStruct->nRef==0 );
    for(i=0; i<pStruct->nLevel; i++){
      sqlite3_free(pStruct->aLevel[i].aSeg);
    }
    sqlite3_free(pStruct);
  }
}